

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O3

int run_tests(test **tests,int test_count)

{
  uint uVar1;
  test *test;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t __size;
  size_t __n;
  long lVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong auStack_50 [2];
  size_t sStack_40;
  long local_38;
  
  sStack_40 = 0x1023d9;
  uVar7 = mixed_version();
  uVar11 = 0;
  sStack_40 = 0x1023ed;
  printf("This is libmixed %s\n",uVar7);
  sStack_40 = 0x1023fe;
  printf("\x1b[1;33m --> \x1b[0;0mWill run %i tests.\n",(ulong)(uint)test_count);
  lVar5 = -((ulong)(uint)test_count * 8 + 0xf & 0xfffffffffffffff0);
  local_38 = (long)&local_38 + lVar5;
  uVar9 = 0;
  if (0 < test_count) {
    uVar10 = 0;
    uVar9 = 0;
    uVar11 = 0;
    do {
      test = tests[uVar10];
      *(undefined8 *)((long)&sStack_40 + lVar5) = 0x102435;
      iVar6 = run_test(test);
      if (iVar6 == 0) {
        lVar8 = (long)(int)uVar9;
        uVar9 = uVar9 + 1;
        *(test **)(local_38 + lVar8 * 8) = tests[uVar10];
      }
      else {
        uVar11 = uVar11 + 1;
      }
      uVar10 = uVar10 + 1;
    } while ((uint)test_count != uVar10);
  }
  *(undefined8 *)((long)&sStack_40 + lVar5) = 0x102473;
  fprintf(_stderr,"\nPassed: %3i",(ulong)uVar11);
  *(undefined8 *)((long)&sStack_40 + lVar5) = 0x102487;
  fprintf(_stderr,"\nFailed: %3i\n",(ulong)uVar9);
  if (uVar9 != 0) {
    *(undefined8 *)((long)&sStack_40 + lVar5) = 0x2e;
    __size = *(size_t *)((long)&sStack_40 + lVar5);
    *(undefined8 *)((long)&sStack_40 + lVar5) = 1;
    __n = *(size_t *)((long)&sStack_40 + lVar5);
    *(undefined8 *)((long)&sStack_40 + lVar5) = 0x1024b7;
    fwrite("\x1b[1;33m --> \x1b[0;0mThe following tests failed:\n",__size,__n,_stderr);
    if (0 < (int)uVar9) {
      uVar10 = 0;
      do {
        puVar2 = *(undefined8 **)(local_38 + uVar10 * 8);
        uVar7 = *puVar2;
        uVar3 = puVar2[1];
        uVar4 = puVar2[2];
        uVar11 = *(uint *)(puVar2 + 3);
        uVar1 = *(uint *)((long)puVar2 + 0x1c);
        *(undefined8 **)((long)&sStack_40 + lVar5) = puVar2 + 4;
        *(ulong *)((long)auStack_50 + lVar5 + 8) = (ulong)uVar1;
        *(undefined8 *)((long)auStack_50 + lVar5) = 0x1024f9;
        fprintf(_stderr,"%s %s %s:%i (%i):\n  %s\n",uVar7,uVar3,uVar4,(ulong)uVar11);
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
  }
  return (int)(uVar9 == 0);
}

Assistant:

int run_tests(struct test *tests[], int test_count){
  printf("This is libmixed %s\n", mixed_version());
  printf("\033[1;33m --> \033[0;0mWill run %i tests.\n", test_count);
  struct test *failed[test_count];
  int failures = 0;
  int passes = 0;

  for(int i=0; i<test_count; ++i){
    if(run_test(tests[i])){
      ++passes;
    }else{
      failed[failures++] = tests[i];
    }
  }
  
  fprintf(stderr, "\nPassed: %3i", passes);
  fprintf(stderr, "\nFailed: %3i\n", failures);
  if(failures){
    fprintf(stderr, "\033[1;33m --> \033[0;0mThe following tests failed:\n");
    for(int i=0; i<failures; ++i){
      struct test *test = failed[i];
      fprintf(stderr, "%s %s %s:%i (%i):\n  %s\n", test->suite, test->name, test->file, test->line, test->form, test->reason);
    }
  }
  return (failures == 0);
}